

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ParmParse.cpp
# Opt level: O0

int __thiscall amrex::ParmParse::query(ParmParse *this,char *name,double *ptr,int ival)

{
  bool bVar1;
  double *in_RSI;
  long in_RDI;
  undefined8 uVar2;
  string *name_00;
  Table *in_stack_ffffffffffffff88;
  allocator<char> local_61;
  string local_60 [8];
  string *in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffb0;
  string local_40 [64];
  
  uVar2 = *(undefined8 *)(in_RDI + 0x50);
  name_00 = (string *)&local_61;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,(char *)in_RSI,(allocator *)name_00);
  prefixedName((ParmParse *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  bVar1 = anon_unknown_12::anon_unknown_0::squeryval<double>
                    (in_stack_ffffffffffffff88,name_00,in_RSI,(int)((ulong)uVar2 >> 0x20),(int)uVar2
                    );
  std::__cxx11::string::~string(local_40);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator(&local_61);
  return (uint)bVar1;
}

Assistant:

int
ParmParse::query (const char* name,
                  double&     ptr,
                  int         ival) const
{
    return squeryval(m_table, prefixedName(name),ptr,ival, LAST);
}